

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void last_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  char *pcVar1;
  sqlite3_value *psVar2;
  
  if ((short)pCtx->pMem->flags < 0) {
    pcVar1 = pCtx->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(pCtx,0x10);
  }
  if (pcVar1 != (char *)0x0) {
    sqlite3ValueFree(*(sqlite3_value **)pcVar1);
    psVar2 = sqlite3_value_dup(*apArg);
    *(sqlite3_value **)pcVar1 = psVar2;
    if (psVar2 == (sqlite3_value *)0x0) {
      sqlite3_result_error_nomem(pCtx);
      return;
    }
    *(int *)(pcVar1 + 8) = *(int *)(pcVar1 + 8) + 1;
  }
  return;
}

Assistant:

static void last_valueStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct LastValueCtx *p;
  UNUSED_PARAMETER(nArg);
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    sqlite3_value_free(p->pVal);
    p->pVal = sqlite3_value_dup(apArg[0]);
    if( p->pVal==0 ){
      sqlite3_result_error_nomem(pCtx);
    }else{
      p->nVal++;
    }
  }
}